

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

bool Js::JavascriptConversion::SameValueCommon<false>(Var aLeft,Var aRight)

{
  uint32 uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int32 iVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  JavascriptTypedNumber<unsigned_long> *pJVar9;
  unsigned_long uVar10;
  JavascriptTypedNumber<long> *pJVar11;
  unsigned_long uVar12;
  uint32 *puVar13;
  JavascriptString *aLeft_00;
  JavascriptString *aRight_00;
  JavascriptSymbol *this;
  JavascriptSymbol *this_00;
  PropertyRecord *pPVar14;
  PropertyRecord *pPVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool local_129;
  JavascriptSymbol *rightSymbol;
  JavascriptSymbol *leftSymbol;
  unsigned_long rightValue_7;
  unsigned_long leftValue_7;
  long rightValue_6;
  unsigned_long leftValue_6;
  long rightValue_5;
  unsigned_long leftValue_5;
  unsigned_long rightValue_4;
  long leftValue_4;
  long rightValue_3;
  long leftValue_3;
  int rightValue_2;
  long leftValue_2;
  unsigned_long rightValue_1;
  int leftValue_1;
  long rightValue;
  double dStack_70;
  int leftValue;
  double dblRight;
  double dblLeft;
  TypeId rightType;
  TypeId leftType;
  Var aRight_local;
  Var aLeft_local;
  Var local_40;
  TypeId local_34;
  Var local_30;
  TypeId local_28;
  TypeId local_24;
  RecyclableObject *pRStack_20;
  TypeId typeId;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId_1;
  
  if (aLeft == aRight) {
    return true;
  }
  _rightType = aRight;
  aRight_local = aLeft;
  local_30 = aLeft;
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(local_30);
  if (bVar3) {
    local_28 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(local_30);
    if (bVar3) {
      local_28 = TypeIds_Number;
    }
    else {
      pRStack_20 = UnsafeVarTo<Js::RecyclableObject>(local_30);
      if (pRStack_20 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_24 = RecyclableObject::GetTypeId(pRStack_20);
      if ((0x57 < (int)local_24) && (BVar4 = RecyclableObject::IsExternal(pRStack_20), BVar4 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_28 = local_24;
    }
  }
  dblLeft._4_4_ = local_28;
  BVar4 = Js::JavascriptOperators::IsUndefinedOrNullType(local_28);
  if (BVar4 != 0) {
    return false;
  }
  local_40 = _rightType;
  if (_rightType == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(local_40);
  if (bVar3) {
    local_34 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(local_40);
    if (bVar3) {
      local_34 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_40);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if ((0x57 < (int)local_14) && (BVar4 = RecyclableObject::IsExternal(pRStack_10), BVar4 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_34 = local_14;
    }
  }
  dblLeft._0_4_ = local_34;
  switch(dblLeft._4_4_) {
  case TypeIds_Boolean:
    return false;
  case TypeIds_FirstNumberType:
    switch(local_34) {
    case TypeIds_FirstNumberType:
      return false;
    case TypeIds_Number:
      dblRight = TaggedInt::ToDouble(aRight_local);
      dStack_70 = JavascriptNumber::GetValue(_rightType);
      goto LAB_00f74d47;
    case TypeIds_Int64Number:
      iVar5 = TaggedInt::ToInt32(aRight_local);
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(_rightType);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      return iVar5 == lVar7;
    case TypeIds_LastNumberType:
      iVar5 = TaggedInt::ToInt32(aRight_local);
      pJVar11 = VarTo<Js::JavascriptTypedNumber<long>>(_rightType);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      return iVar5 == lVar7;
    }
    break;
  case TypeIds_Number:
    switch(local_34) {
    case TypeIds_FirstNumberType:
      dblRight = JavascriptNumber::GetValue(aRight_local);
      dStack_70 = TaggedInt::ToDouble(_rightType);
      break;
    case TypeIds_Number:
      dblRight = JavascriptNumber::GetValue(aRight_local);
      dStack_70 = JavascriptNumber::GetValue(_rightType);
      break;
    case TypeIds_Int64Number:
      dblRight = JavascriptNumber::GetValue(aRight_local);
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(_rightType);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      dStack_70 = (double)lVar7;
      break;
    case TypeIds_LastNumberType:
      dblRight = JavascriptNumber::GetValue(aRight_local);
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(_rightType);
      uVar10 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar9);
      auVar17._8_4_ = (int)(uVar10 >> 0x20);
      auVar17._0_8_ = uVar10;
      auVar17._12_4_ = 0x45300000;
      dStack_70 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
      break;
    default:
      goto switchD_00f748f5_default;
    }
LAB_00f74d47:
    BVar4 = JavascriptNumber::IsNan(dblRight);
    if ((BVar4 != 0) && (BVar4 = JavascriptNumber::IsNan(dStack_70), BVar4 != 0)) {
      return true;
    }
    puVar13 = NumberUtilities::LuLoDbl(&dblRight);
    uVar1 = *puVar13;
    puVar13 = NumberUtilities::LuLoDbl(&stack0xffffffffffffff90);
    local_129 = false;
    if (uVar1 == *puVar13) {
      puVar13 = NumberUtilities::LuHiDbl(&dblRight);
      uVar1 = *puVar13;
      puVar13 = NumberUtilities::LuHiDbl(&stack0xffffffffffffff90);
      local_129 = uVar1 == *puVar13;
    }
    return local_129;
  case TypeIds_Int64Number:
    switch(local_34) {
    case TypeIds_FirstNumberType:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight_local);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      iVar5 = TaggedInt::ToInt32(_rightType);
      return lVar7 == iVar5;
    case TypeIds_Number:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight_local);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      dblRight = (double)lVar7;
      dStack_70 = JavascriptNumber::GetValue(_rightType);
      goto LAB_00f74d47;
    case TypeIds_Int64Number:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight_local);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(_rightType);
      lVar8 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      return lVar7 == lVar8;
    case TypeIds_LastNumberType:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight_local);
      lVar7 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      pJVar11 = VarTo<Js::JavascriptTypedNumber<long>>(_rightType);
      lVar8 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      return lVar7 == lVar8;
    }
    break;
  case TypeIds_LastNumberType:
    switch(local_34) {
    case TypeIds_FirstNumberType:
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight_local);
      uVar10 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar9);
      iVar5 = TaggedInt::ToInt32(_rightType);
      return uVar10 == (long)iVar5;
    case TypeIds_Number:
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight_local);
      uVar10 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar9);
      auVar16._8_4_ = (int)(uVar10 >> 0x20);
      auVar16._0_8_ = uVar10;
      auVar16._12_4_ = 0x45300000;
      dblRight = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
      dStack_70 = JavascriptNumber::GetValue(_rightType);
      goto LAB_00f74d47;
    case TypeIds_Int64Number:
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight_local);
      uVar10 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar9);
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(_rightType);
      uVar12 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      return uVar10 == uVar12;
    case TypeIds_LastNumberType:
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight_local);
      uVar10 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar9);
      pJVar11 = VarTo<Js::JavascriptTypedNumber<long>>(_rightType);
      uVar12 = JavascriptTypedNumber<long>::GetValue(pJVar11);
      return uVar10 == uVar12;
    }
    break;
  case TypeIds_String:
    if (local_34 == TypeIds_String) {
      aLeft_00 = UnsafeVarTo<Js::JavascriptString>(aRight_local);
      aRight_00 = UnsafeVarTo<Js::JavascriptString>(_rightType);
      bVar3 = JavascriptString::Equals(aLeft_00,aRight_00);
      return bVar3;
    }
    break;
  case TypeIds_Symbol:
    if (local_34 == TypeIds_Symbol) {
      this = UnsafeVarTo<Js::JavascriptSymbol>(aRight_local);
      this_00 = UnsafeVarTo<Js::JavascriptSymbol>(_rightType);
      pPVar14 = JavascriptSymbol::GetValue(this);
      pPVar15 = JavascriptSymbol::GetValue(this_00);
      if (pPVar14 == pPVar15) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0xd2,"(leftSymbol->GetValue() != rightSymbol->GetValue())",
                                    "leftSymbol->GetValue() != rightSymbol->GetValue()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
switchD_00f748f5_default:
  return false;
}

Assistant:

bool JavascriptConversion::SameValueCommon(Var aLeft, Var aRight)
    {
        if (aLeft == aRight)
        {
            return true;
        }

        TypeId leftType = JavascriptOperators::GetTypeId(aLeft);

        if (JavascriptOperators::IsUndefinedOrNullType(leftType))
        {
            return false;
        }

        TypeId rightType = JavascriptOperators::GetTypeId(aRight);
        double dblLeft, dblRight;

        switch (leftType)
        {
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Integer:
                return false;
            case TypeIds_Number:
                dblLeft     = TaggedInt::ToDouble(aLeft);
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                int leftValue = TaggedInt::ToInt32(aLeft);
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            case TypeIds_UInt64Number:
                {
                int leftValue = TaggedInt::ToInt32(aLeft);
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            }
            break;
        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                int rightValue = TaggedInt::ToInt32(aRight);
                return leftValue == rightValue;
                }
            case TypeIds_Number:
                dblLeft     = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            case TypeIds_UInt64Number:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return ((unsigned __int64)leftValue == rightValue);
                }
            }
            break;
        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = TaggedInt::ToInt32(aRight);
                return (leftValue == (unsigned __int64)rightValue);
                }
            case TypeIds_Number:
                dblLeft     = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return (leftValue == (unsigned __int64)rightValue);
                }
            case TypeIds_UInt64Number:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            }
            break;
        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = TaggedInt::ToDouble(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = (double)UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_UInt64Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = (double)UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = JavascriptNumber::GetValue(aRight);
CommonNumber:
                if (JavascriptNumber::IsNan(dblLeft) && JavascriptNumber::IsNan(dblRight))
                {
                    return true;
                }

                if (zero)
                {
                    // SameValueZero(+0,-0) returns true;
                    return dblLeft == dblRight;
                }
                else
                {
                    // SameValue(+0,-0) returns false;
                    return (NumberUtilities::LuLoDbl(dblLeft) == NumberUtilities::LuLoDbl(dblRight) &&
                        NumberUtilities::LuHiDbl(dblLeft) == NumberUtilities::LuHiDbl(dblRight));
                }
            }
            break;
        case TypeIds_Boolean:
            return false;
        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_String:
                return JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
            }
            break;
#if DBG
        case TypeIds_Symbol:
            if (rightType == TypeIds_Symbol)
            {
                JavascriptSymbol* leftSymbol = UnsafeVarTo<JavascriptSymbol>(aLeft);
                JavascriptSymbol* rightSymbol = UnsafeVarTo<JavascriptSymbol>(aRight);
                Assert(leftSymbol->GetValue() != rightSymbol->GetValue());
            }
#endif
        default:
            break;
        }
        return false;
    }